

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::GLSL420Pack::BindingImagesTest::verifyAdditionalResults(BindingImagesTest *this)

{
  int iVar1;
  bool bVar2;
  int *piVar3;
  BindingImagesTest *this_00;
  
  if (this->m_test_case == TEX_BUFFER) {
    piVar3 = (int *)Utils::buffer::map(&this->m_goku_buffer,35000);
    iVar1 = *piVar3;
    Utils::buffer::unmap(&this->m_goku_buffer);
    if (iVar1 == -0xff0100) {
      piVar3 = (int *)Utils::buffer::map(&this->m_vegeta_buffer,35000);
      iVar1 = *piVar3;
      Utils::buffer::unmap(&this->m_vegeta_buffer);
      if (iVar1 == -0xff0100) {
        piVar3 = (int *)Utils::buffer::map(&this->m_trunks_buffer,35000);
        iVar1 = *piVar3;
        Utils::buffer::unmap(&this->m_trunks_buffer);
        return iVar1 == -0xff0100;
      }
    }
  }
  else {
    this_00 = this;
    bVar2 = BindingImageTest::verifyTexture(&this->super_BindingImageTest,&this->m_goku_texture);
    if ((bVar2) &&
       (bVar2 = BindingImageTest::verifyTexture
                          (&this_00->super_BindingImageTest,&this->m_vegeta_texture), bVar2)) {
      bVar2 = BindingImageTest::verifyTexture
                        (&this_00->super_BindingImageTest,&this->m_trunks_texture);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool BindingImagesTest::verifyAdditionalResults() const
{
	if (Utils::TEX_BUFFER != m_test_case)
	{
		return (verifyTexture(m_goku_texture) && verifyTexture(m_vegeta_texture) && verifyTexture(m_trunks_texture));
	}
	else
	{
		return (verifyBuffer(m_goku_buffer) && verifyBuffer(m_vegeta_buffer) && verifyBuffer(m_trunks_buffer));
	}
}